

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxStructMember::Resolve(FxStructMember *this,FCompileContext *ctx)

{
  EFxType EVar1;
  PType *this_00;
  _func_int **pp_Var2;
  PField *pPVar3;
  PStruct *pPVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  FxClassDefaults *this_01;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_00;
  PPointer *pPVar9;
  PField *pPVar10;
  undefined4 extraout_var_01;
  FxExpression *this_02;
  FxConstant *pFVar11;
  char *pcVar12;
  PClass *pPVar13;
  FName local_3c;
  FName local_38;
  FName local_34;
  FxExpression *pFVar8;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->classx != (FxExpression *)0x0) {
    iVar6 = (*this->classx->_vptr_FxExpression[2])();
    pFVar8 = (FxExpression *)CONCAT44(extraout_var,iVar6);
    this->classx = pFVar8;
    if (pFVar8 != (FxExpression *)0x0) {
      iVar6 = *(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
      bVar5 = DObject::IsKindOf((DObject *)pFVar8->ValueType,PPointer::RegistrationInfo.MyClass);
      if (iVar6 == 0x249) {
        if ((bVar5) &&
           (pPVar13 = AActor::RegistrationInfo.MyClass,
           bVar5 = DObject::IsKindOf((DObject *)
                                     this->classx->ValueType[1].super_PTypeBase.super_DObject.
                                     _vptr_DObject,AActor::RegistrationInfo.MyClass), bVar5)) {
          this_01 = (FxClassDefaults *)
                    FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar13);
          FxClassDefaults::FxClassDefaults
                    (this_01,this->classx,&(this->super_FxExpression).ScriptPosition);
          this->classx = (FxExpression *)0x0;
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          UNRECOVERED_JUMPTABLE = (this_01->super_FxExpression)._vptr_FxExpression[2];
LAB_00513c8d:
          iVar6 = (*UNRECOVERED_JUMPTABLE)(this_01,ctx);
          return (FxExpression *)CONCAT44(extraout_var_00,iVar6);
        }
        pcVar12 = "\'Default\' requires an actor type.";
      }
      else {
        this_00 = this->classx->ValueType;
        if (!bVar5) {
          pPVar13 = PStruct::RegistrationInfo.MyClass;
          bVar5 = DObject::IsKindOf((DObject *)this_00,PStruct::RegistrationInfo.MyClass);
          if (!bVar5) goto LAB_00513eae;
          pFVar8 = this->classx;
          EVar1 = pFVar8->ExprType;
          if (EVar1 - EFX_ClassMember < 2) {
            pcVar12 = pFVar8[1].ScriptPosition.FileName.Chars;
            pPVar10 = (PField *)DObject::operator_new(0x40);
            pPVar3 = this->membervar;
            local_34.Index =
                 *(int *)&(pPVar3->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
            PField::PField(pPVar10,&local_34,pPVar3->Type,*(uint *)(pcVar12 + 0x38) | pPVar3->Flags,
                           *(long *)(pcVar12 + 0x28) + pPVar3->Offset,0);
            pPVar10->BitValue = this->membervar->BitValue;
            pFVar8 = this->classx;
            pFVar8[1].ScriptPosition.FileName.Chars = (char *)pPVar10;
            goto LAB_00513e54;
          }
          if (EVar1 == EFX_LocalVariable) {
            pPVar4 = (PStruct *)pFVar8->ValueType;
            if ((pPVar4 == TypeVector2) || (pPVar4 == TypeVector3)) {
              pPVar3 = this->membervar;
              *(int *)((long)&pFVar8[1].ScriptPosition.FileName.Chars + 4) =
                   (int)(pPVar3->Offset >> 3);
              pFVar8->ValueType = pPVar3->Type;
              this->classx = (FxExpression *)0x0;
              (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
              return pFVar8;
            }
            if (pPVar4 == TypeColorStruct) {
              uVar7 = *(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                               field_0x24 - 0x28f;
              if (uVar7 < 3) {
                pFVar8->ValueType = (PType *)TypeColor;
                this_02 = (FxExpression *)
                          FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar13);
                pFVar11 = (FxConstant *)
                          FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar13);
                FxConstant::FxConstant
                          (pFVar11,uVar7 * -8 + 0x18,&(this->super_FxExpression).ScriptPosition);
                pPVar13 = (PClass *)0x117;
                FxShift::FxShift((FxShift *)this_02,0x117,pFVar8,(FxExpression *)pFVar11);
                pFVar8 = this_02;
              }
              else {
                pFVar8->ValueType = (PType *)TypeColor;
              }
              this_01 = (FxClassDefaults *)
                        FxExpression::operator_new((FxExpression *)0x40,(size_t)pPVar13);
              pFVar11 = (FxConstant *)
                        FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar13);
              FxConstant::FxConstant(pFVar11,0xff,&(this->super_FxExpression).ScriptPosition);
              FxBitOp::FxBitOp((FxBitOp *)this_01,0x26,pFVar8,(FxExpression *)pFVar11);
              this->classx = (FxExpression *)0x0;
              (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
              UNRECOVERED_JUMPTABLE = (this_01->super_FxExpression)._vptr_FxExpression[2];
              goto LAB_00513c8d;
            }
          }
          else {
            if (EVar1 == EFX_GlobalVariable) {
              pp_Var2 = pFVar8[1]._vptr_FxExpression;
              pPVar10 = (PField *)DObject::operator_new(0x40);
              pPVar3 = this->membervar;
              local_38.Index =
                   *(int *)&(pPVar3->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
              PField::PField(pPVar10,&local_38,pPVar3->Type,*(uint *)(pp_Var2 + 7) | pPVar3->Flags,
                             (size_t)(pp_Var2[5] + pPVar3->Offset),0);
              pPVar10->BitValue = this->membervar->BitValue;
              pFVar8 = this->classx;
              pFVar8[1]._vptr_FxExpression = (_func_int **)pPVar10;
LAB_00513e54:
              pFVar8->isresolved = false;
              iVar6 = (*pFVar8->_vptr_FxExpression[2])(pFVar8,ctx);
              this->classx = (FxExpression *)0x0;
              return (FxExpression *)CONCAT44(extraout_var_01,iVar6);
            }
            if (EVar1 == EFX_StackVariable) {
              pp_Var2 = pFVar8[1]._vptr_FxExpression;
              pPVar10 = (PField *)DObject::operator_new(0x40);
              pPVar3 = this->membervar;
              local_3c.Index =
                   *(int *)&(pPVar3->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
              PField::PField(pPVar10,&local_3c,pPVar3->Type,*(uint *)(pp_Var2 + 7) | pPVar3->Flags,
                             (size_t)(pp_Var2[5] + pPVar3->Offset),0);
              pPVar10->BitValue = this->membervar->BitValue;
              FxStackVariable::ReplaceField((FxStackVariable *)this->classx,pPVar10);
              pFVar8 = this->classx;
              goto LAB_00513e54;
            }
          }
          iVar6 = (*pFVar8->_vptr_FxExpression[4])(pFVar8,ctx,&this->AddressWritable);
          if ((char)iVar6 == '\0') {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "unable to dereference left side of %s",
                       FName::NameData.NameArray
                       [*(int *)&(this->membervar->super_PSymbol).super_PTypeBase.super_DObject.
                                 field_0x24].Text);
            goto LAB_00513cf6;
          }
LAB_00513eae:
          (this->super_FxExpression).ValueType = this->membervar->Type;
          return &this->super_FxExpression;
        }
        pPVar9 = dyn_cast<PPointer>((DObject *)this_00);
        if ((pPVar9 != (PPointer *)0x0) &&
           (bVar5 = DObject::IsKindOf((DObject *)pPVar9->PointedType,
                                      PStruct::RegistrationInfo.MyClass), bVar5)) goto LAB_00513eae;
        pcVar12 = "Member variable requires a struct or class object.";
      }
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar12);
    }
  }
LAB_00513cf6:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxStructMember::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(classx, ctx);

	if (membervar->SymbolName == NAME_Default)
	{
		if (!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer))
			|| !static_cast<PPointer *>(classx->ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}
		FxExpression * x = new FxClassDefaults(classx, ScriptPosition);
		classx = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		PPointer *ptrtype = dyn_cast<PPointer>(classx->ValueType);
		if (ptrtype == nullptr || !ptrtype->PointedType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Member variable requires a struct or class object.");
			delete this;
			return nullptr;
		}
	}
	else if (classx->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		// if this is a struct within a class or another struct we can simplify the expression by creating a new PField with a cumulative offset.
		if (classx->ExprType == EFX_ClassMember || classx->ExprType == EFX_StructMember)
		{
			auto parentfield = static_cast<FxStructMember *>(classx)->membervar;
			// PFields are garbage collected so this will be automatically taken care of later.
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStructMember *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_GlobalVariable)
		{
			auto parentfield = static_cast<FxGlobalVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxGlobalVariable *>(classx)->membervar = newfield;
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_StackVariable)
		{
			auto parentfield = static_cast<FxStackVariable *>(classx)->membervar;
			auto newfield = new PField(membervar->SymbolName, membervar->Type, membervar->Flags | parentfield->Flags, membervar->Offset + parentfield->Offset);
			newfield->BitValue = membervar->BitValue;
			static_cast<FxStackVariable *>(classx)->ReplaceField(newfield);
			classx->isresolved = false;	// re-resolve the parent so it can also check if it can be optimized away.
			auto x = classx->Resolve(ctx);
			classx = nullptr;
			return x;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->IsVector())	// vectors are a special case because they are held in registers
		{
			// since this is a vector, all potential things that may get here are single float or an xy-vector.
			auto locvar = static_cast<FxLocalVariable *>(classx);
			locvar->RegOffset = int(membervar->Offset / 8);
			locvar->ValueType = membervar->Type;
			classx = nullptr;
			delete this;
			return locvar;
		}
		else if (classx->ExprType == EFX_LocalVariable && classx->ValueType == TypeColorStruct)
		{
			// This needs special treatment because it'd require accessing the register via address.
			// Fortunately this is the only place where this kind of access is ever needed so an explicit handling is acceptable.
			int bits;
			switch (membervar->SymbolName.GetIndex())
			{
			case NAME_a: bits = 24; break;
			case NAME_r: bits = 16; break;
			case NAME_g: bits = 8; break;
			case NAME_b: default: bits = 0; break;
			}
			classx->ValueType = TypeColor;	// need to set it back.
			FxExpression *x = classx;
			if (bits > 0) x = new FxShift(TK_URShift, x, new FxConstant(bits, ScriptPosition));
			x = new FxBitOp('&', x, new FxConstant(255, ScriptPosition));
			classx = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			if (!(classx->RequestAddress(ctx, &AddressWritable)))
			{
				ScriptPosition.Message(MSG_ERROR, "unable to dereference left side of %s", membervar->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}
	ValueType = membervar->Type;
	return this;
}